

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_parser.cpp
# Opt level: O0

exception_ptr test_parse_fails(char *text)

{
  size_t sVar1;
  char *in_RSI;
  wstring_view text_00;
  allocator<wchar_t> local_49;
  wstring local_48 [32];
  undefined1 local_28 [16];
  char *text_local;
  
  text_local = text;
  sVar1 = strlen(in_RSI);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<char_const*,void>(local_48,in_RSI,in_RSI + sVar1,&local_49);
  local_28 = std::__cxx11::wstring::operator_cast_to_basic_string_view(local_48);
  text_00._M_str = local_28._0_8_;
  text_00._M_len = (size_t)text;
  test_parse_fails(text_00);
  std::__cxx11::wstring::~wstring(local_48);
  std::allocator<wchar_t>::~allocator(&local_49);
  return (exception_ptr)text;
}

Assistant:

auto test_parse_fails(const char* text) {
    return test_parse_fails(std::wstring{text, text+std::strlen(text)});
}